

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtrace.c
# Opt level: O2

int libtest_debug_cb(CURL *handle,curl_infotype type,uchar *data,size_t size,void *userp)

{
  int iVar1;
  FILE *__stream;
  uchar uVar2;
  time_t tVar3;
  tm *ptVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  uchar *puVar10;
  timeval tVar11;
  char timebuf [20];
  time_t secs;
  
  timebuf[0] = '\0';
  if (*userp != 0) {
    tVar11 = tutil_tvnow();
    if (known_offset != '\x01') {
      tVar3 = time((time_t *)0x0);
      epoch_offset = tVar3 - tVar11.tv_sec;
      known_offset = '\x01';
    }
    secs = epoch_offset + tVar11.tv_sec;
    ptVar4 = localtime(&secs);
    curl_msnprintf(timebuf,0x14,"%02d:%02d:%02d.%06ld ",ptVar4->tm_hour,ptVar4->tm_min,
                   ptVar4->tm_sec,tVar11.tv_usec);
  }
  __stream = _stderr;
  switch(type) {
  case CURLINFO_TEXT:
    curl_mfprintf(_stderr,"%s== Info: %s",timebuf,data);
    return 0;
  case CURLINFO_HEADER_IN:
    pcVar5 = "<= Recv header";
    break;
  case CURLINFO_HEADER_OUT:
    pcVar5 = "=> Send header";
    break;
  case CURLINFO_DATA_IN:
    pcVar5 = "<= Recv data";
    break;
  case CURLINFO_DATA_OUT:
    pcVar5 = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_IN:
    pcVar5 = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    pcVar5 = "=> Send SSL data";
    break;
  default:
    goto switchD_0010192c_default;
  }
  iVar1 = *(int *)((long)userp + 4);
  lVar8 = 0x40;
  if (iVar1 == 0) {
    lVar8 = 0x10;
  }
  curl_mfprintf(_stderr,"%s%s, %zu bytes (0x%zx)\n",timebuf,pcVar5,size,size);
  for (uVar7 = 0; uVar7 < size; uVar7 = uVar7 + lVar8) {
    curl_mfprintf(__stream,"%04zx: ",uVar7);
    lVar6 = lVar8;
    uVar9 = uVar7;
    if (iVar1 == 0) {
      while (lVar6 != 0) {
        if (uVar9 < size) {
          curl_mfprintf(__stream,"%02x ",data[uVar9]);
        }
        else {
          fputs("   ",__stream);
        }
        lVar6 = lVar6 + -1;
        uVar9 = uVar9 + 1;
      }
    }
    lVar6 = 0;
    puVar10 = data + 2;
LAB_00101a44:
    if ((lVar8 == lVar6) || (size <= lVar6 + uVar7)) goto LAB_00101afe;
    if (iVar1 == 0) {
      uVar2 = puVar10[uVar7 - 2];
      if ((char)uVar2 < ' ') {
        uVar2 = '.';
      }
      curl_mfprintf(__stream,"%c",uVar2);
      goto LAB_00101ae3;
    }
    uVar2 = puVar10[uVar7 - 2];
    if ((size <= lVar6 + uVar7 + 1) || (uVar2 != '\r')) {
      if ((char)uVar2 < ' ') {
        uVar2 = '.';
      }
LAB_00101ab5:
      curl_mfprintf(__stream,"%c",uVar2);
      if (((lVar6 + uVar7 + 2 < size) && (puVar10[uVar7 - 1] == '\r')) && (puVar10[uVar7] == '\n'))
      {
        uVar7 = (uVar7 + lVar6) - 0x3d;
        goto LAB_00101afe;
      }
LAB_00101ae3:
      lVar6 = lVar6 + 1;
      puVar10 = puVar10 + 1;
      goto LAB_00101a44;
    }
    uVar2 = '.';
    if (puVar10[uVar7 - 1] != '\n') goto LAB_00101ab5;
    uVar7 = (uVar7 + lVar6) - 0x3e;
LAB_00101afe:
    fputc(10,__stream);
  }
  fflush(__stream);
switchD_0010192c_default:
  return 0;
}

Assistant:

int libtest_debug_cb(CURL *handle, curl_infotype type,
                     unsigned char *data, size_t size,
                     void *userp)
{

  struct libtest_trace_cfg *trace_cfg = userp;
  const char *text;
  struct timeval tv;
  char timebuf[20];
  char *timestr;
  time_t secs;

  (void)handle;

  timebuf[0] = '\0';
  timestr = &timebuf[0];

  if(trace_cfg->tracetime) {
    struct tm *now;
    tv = tutil_tvnow();
    if(!known_offset) {
      epoch_offset = time(NULL) - tv.tv_sec;
      known_offset = 1;
    }
    secs = epoch_offset + tv.tv_sec;
    now = localtime(&secs);  /* not thread safe but we don't care */
    msnprintf(timebuf, sizeof(timebuf), "%02d:%02d:%02d.%06ld ",
              now->tm_hour, now->tm_min, now->tm_sec, (long)tv.tv_usec);
  }

  switch(type) {
  case CURLINFO_TEXT:
    fprintf(stderr, "%s== Info: %s", timestr, (char *)data);
    /* FALLTHROUGH */
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  }

  libtest_debug_dump(timebuf, text, stderr, data, size, trace_cfg->nohex);
  return 0;
}